

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
* __thiscall
EOPlus::Parser::ParseStateBlock_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
           *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  int iVar2;
  Parser_Token_Server_Base *pPVar3;
  bool bVar4;
  Parser_Error *pPVar5;
  Token *t_00;
  Token *t_01;
  allocator<char> local_309;
  bool has_desc;
  string name;
  _Any_data local_2c8;
  code *local_2b8;
  code *pcStack_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  Token t;
  State state;
  undefined1 local_108 [64];
  Token local_c8;
  Token local_78;
  
  util::variant::variant((variant *)local_108);
  Token::Token(&t,Invalid,(variant *)local_108);
  std::__cxx11::string::~string((string *)(local_108 + 0x10));
  bVar4 = GetToken(this,&t,1);
  if (!bVar4) {
    pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&has_desc,"Expected state-name after \'state\'.",
               (allocator<char> *)&local_288);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &has_desc," Got: ");
    Token::Token(&local_c8,
                 &((this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)->
                  reject_token);
    token_got_string_abi_cxx11_(&local_2a8,(EOPlus *)&local_c8,t_01);
    std::operator+(&state.name,&name,&local_2a8);
    pPVar3 = (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
    iVar1 = pPVar3->line;
    iVar2 = pPVar3->reject_line;
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    Parser_Error::Parser_Error(pPVar5,&state.name,iVar2);
    __cxa_throw(pPVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
  }
  util::variant::GetString_abi_cxx11_(&name,&t.data);
  bVar4 = GetToken(this,&t,0x40);
  if (bVar4) {
    util::variant::GetString_abi_cxx11_(&state.name,&t.data);
    bVar4 = std::operator==(&state.name,"{");
    std::__cxx11::string::~string((string *)&state);
    if (bVar4) {
      has_desc = false;
      State::State(&state);
      local_2b8 = (code *)0x0;
      pcStack_2b0 = (code *)0x0;
      local_2c8._M_unused._M_object = (void *)0x0;
      local_2c8._8_8_ = 0;
      local_2c8._M_unused._M_object = operator_new(0x18);
      *(bool **)local_2c8._M_unused._0_8_ = &has_desc;
      *(Parser **)((long)local_2c8._M_unused._0_8_ + 8) = this;
      *(State **)((long)local_2c8._M_unused._0_8_ + 0x10) = &state;
      pcStack_2b0 = std::
                    _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:450:54)>
                    ::_M_invoke;
      local_2b8 = std::
                  _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:450:54)>
                  ::_M_manager;
      local_250 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:473:5)>
                  ::_M_invoke;
      local_258 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:473:5)>
                  ::_M_manager;
      local_268._M_unused._M_object = &name;
      local_268._8_8_ = this;
      ParseRuleActionBlock
                (this,&state.rules,&state.actions,
                 (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_2c8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&local_268);
      std::_Function_base::~_Function_base((_Function_base *)&local_268);
      std::_Function_base::~_Function_base((_Function_base *)&local_2c8);
      std::__cxx11::string::_M_assign((string *)&state);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_EOPlus::State_&,_true>
                (__return_storage_ptr__,&name,&state);
      State::~State(&state);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&t.data.val_string);
      return __return_storage_ptr__;
    }
  }
  pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"Expected opening brace \'{\' after state-name.",&local_309);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&has_desc,
                 &local_2a8," Got: ");
  Token::Token(&local_78,
               &((this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl)->
                reject_token);
  token_got_string_abi_cxx11_(&local_288,(EOPlus *)&local_78,t_00);
  std::operator+(&state.name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&has_desc,
                 &local_288);
  pPVar3 = (this->tok)._M_t.
           super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
  iVar1 = pPVar3->line;
  iVar2 = pPVar3->reject_line;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  Parser_Error::Parser_Error(pPVar5,&state.name,iVar2);
  __cxa_throw(pPVar5,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<std::string, State> Parser::ParseStateBlock()
	{
		Token t;

		if (this->GetToken(t, Token::Identifier))
		{
			std::string name = t.data;

			if (this->GetToken(t, Token::Symbol) && std::string(t.data) == "{")
			{
				bool has_desc = false;
				State state;

				ParseRuleActionBlock(state.rules, state.actions, [&](std::string entry) -> bool
				{
					if (entry == "desc")
					{
						if (has_desc)
							PARSER_ERROR("State can only contain one description.");

						has_desc = true;
						state.desc = this->ParseDesc();
						return true;
					}
					else if (entry == "goal")
					{
						Rule rule = this->ParseRule();
						state.rules.push_back(rule);
						state.goal_rule = state.rules.size() - 1;
						return true;
					}
					else
					{
						return false;
					}
				},
				[&](std::string expected)
				{
					PARSER_ERROR_GOT("Expected state-block entry (" + expected + "/goal/desc) or closing brace '}' in state '" + name + "'.");
				});

				state.name = name;
				return std::pair<std::string, State>(name, state);
			}

			PARSER_ERROR_GOT("Expected opening brace '{' after state-name.");
		}

		PARSER_ERROR_GOT("Expected state-name after 'state'.");
	}